

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIfCommand.cxx
# Opt level: O2

bool __thiscall
cmIfFunctionBlocker::IsFunctionBlocked
          (cmIfFunctionBlocker *this,cmListFileFunction *lff,cmMakefile *mf,
          cmExecutionStatus *inStatus)

{
  uint *puVar1;
  pointer pcVar2;
  MessageType MVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  cmake *pcVar8;
  uint uVar9;
  ulong uVar10;
  cmExecutionStatus status;
  MessageType messType;
  pointer local_e0;
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> expandedArguments;
  string errorString;
  string err;
  cmListFileBacktrace bt;
  cmConditionEvaluator conditionEvaluator;
  
  iVar5 = cmsys::SystemTools::Strucmp((lff->super_cmListFileContext).Name._M_dataplus._M_p,"if");
  if (iVar5 == 0) {
    this->ScopeDepth = this->ScopeDepth + 1;
LAB_002bea1e:
    std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::push_back
              (&this->Functions,lff);
  }
  else {
    iVar5 = cmsys::SystemTools::Strucmp
                      ((lff->super_cmListFileContext).Name._M_dataplus._M_p,"endif");
    if (iVar5 != 0) goto LAB_002bea1e;
    puVar1 = &this->ScopeDepth;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 != 0) goto LAB_002bea1e;
    cmMakefile::RemoveFunctionBlocker
              ((cmMakefile *)&bt,(cmFunctionBlocker *)mf,(cmListFileFunction *)this);
    iVar5 = 0;
    if (bt.super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
        super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) goto LAB_002bea30;
    local_e0 = bt.super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
               super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
               super__Vector_impl_data._M_start;
    status.ReturnInvoked = false;
    status.BreakInvoked = false;
    status.ContinueInvoked = false;
    status.NestedError = false;
    uVar9 = 0;
    while( true ) {
      uVar10 = (ulong)uVar9;
      pcVar2 = (this->Functions).
               super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)(((long)(this->Functions).
                         super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar2) / 0x60) <=
          uVar10) break;
      iVar6 = cmsys::SystemTools::Strucmp
                        (pcVar2[uVar10].super_cmListFileContext.Name._M_dataplus._M_p,"if");
      iVar7 = cmsys::SystemTools::Strucmp
                        ((this->Functions).
                         super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar10].super_cmListFileContext.
                         Name._M_dataplus._M_p,"endif");
      iVar5 = (iVar5 + (uint)(iVar6 == 0)) - (uint)(iVar7 == 0);
      if (iVar5 == 0) {
        iVar6 = cmsys::SystemTools::Strucmp
                          ((this->Functions).
                           super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar10].super_cmListFileContext
                           .Name._M_dataplus._M_p,"else");
        if (iVar6 == 0) {
          bVar4 = this->HasRun;
          this->IsBlocking = bVar4;
          this->HasRun = true;
          if (bVar4 == false) {
            pcVar8 = cmMakefile::GetCMakeInstance(mf);
            if (pcVar8->Trace == true) {
              cmMakefile::PrintCommandTrace
                        (mf,(this->Functions).
                            super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                            ._M_impl.super__Vector_impl_data._M_start + uVar10);
            }
          }
        }
        else {
          iVar6 = cmsys::SystemTools::Strucmp
                            ((this->Functions).
                             super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar10].
                             super_cmListFileContext.Name._M_dataplus._M_p,"elseif");
          if (iVar6 != 0) goto LAB_002be806;
          if (this->HasRun == true) {
            this->IsBlocking = true;
          }
          else {
            pcVar8 = cmMakefile::GetCMakeInstance(mf);
            if (pcVar8->Trace == true) {
              cmMakefile::PrintCommandTrace
                        (mf,(this->Functions).
                            super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                            ._M_impl.super__Vector_impl_data._M_start + uVar10);
            }
            errorString._M_dataplus._M_p = (pointer)&errorString.field_2;
            errorString._M_string_length = 0;
            expandedArguments.
            super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            errorString.field_2._M_local_buf[0] = '\0';
            expandedArguments.
            super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            expandedArguments.
            super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            cmMakefile::ExpandArguments
                      (mf,&(this->Functions).
                           super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar10].Arguments,
                       &expandedArguments,(char *)0x0);
            cmConditionEvaluator::cmConditionEvaluator(&conditionEvaluator,mf);
            bVar4 = cmConditionEvaluator::IsTrue
                              (&conditionEvaluator,&expandedArguments,&errorString,&messType);
            if (errorString._M_string_length != 0) {
              cmIfCommandError_abi_cxx11_(&err,&expandedArguments);
              std::__cxx11::string::append((string *)&err);
              cmMakefile::GetBacktrace
                        (&bt,mf,&(this->Functions).
                                 super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar10].
                                 super_cmListFileContext);
              pcVar8 = cmMakefile::GetCMakeInstance(mf);
              MVar3 = messType;
              cmake::IssueMessage(pcVar8,messType,&err,&bt);
              if (MVar3 == FATAL_ERROR) {
                cmSystemTools::s_FatalErrorOccured = true;
                std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::~vector
                          (&bt.super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>);
                std::__cxx11::string::~string((string *)&err);
                std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
                ~vector(&expandedArguments);
                std::__cxx11::string::~string((string *)&errorString);
                break;
              }
              std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::~vector
                        (&bt.super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>);
              std::__cxx11::string::~string((string *)&err);
            }
            if (bVar4) {
              this->IsBlocking = false;
              this->HasRun = true;
            }
            std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
            ~vector(&expandedArguments);
            std::__cxx11::string::~string((string *)&errorString);
          }
        }
      }
      else {
LAB_002be806:
        if (this->IsBlocking == false) {
          status.ReturnInvoked = false;
          status.BreakInvoked = false;
          status.ContinueInvoked = false;
          status.NestedError = false;
          cmMakefile::ExecuteCommand
                    (mf,(this->Functions).
                        super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                        _M_impl.super__Vector_impl_data._M_start + uVar10,&status);
          if (status.ReturnInvoked == true) {
            inStatus->ReturnInvoked = true;
            break;
          }
          if (status.BreakInvoked == true) {
            inStatus->BreakInvoked = true;
            break;
          }
          if (status.ContinueInvoked == true) {
            inStatus->ContinueInvoked = true;
            break;
          }
        }
      }
      uVar9 = uVar9 + 1;
    }
    (**(code **)((local_e0->Name)._M_dataplus._M_p + 0x18))();
  }
  iVar5 = 1;
LAB_002bea30:
  return SUB41(iVar5,0);
}

Assistant:

bool cmIfFunctionBlocker::
IsFunctionBlocked(const cmListFileFunction& lff,
                  cmMakefile &mf,
                  cmExecutionStatus &inStatus)
{
  // we start by recording all the functions
  if (!cmSystemTools::Strucmp(lff.Name.c_str(),"if"))
    {
    this->ScopeDepth++;
    }
  else if (!cmSystemTools::Strucmp(lff.Name.c_str(),"endif"))
    {
    this->ScopeDepth--;
    // if this is the endif for this if statement, then start executing
    if (!this->ScopeDepth)
      {
      // Remove the function blocker for this scope or bail.
      cmsys::auto_ptr<cmFunctionBlocker>
        fb(mf.RemoveFunctionBlocker(this, lff));
      if(!fb.get()) { return false; }

      // execute the functions for the true parts of the if statement
      cmExecutionStatus status;
      int scopeDepth = 0;
      for(unsigned int c = 0; c < this->Functions.size(); ++c)
        {
        // keep track of scope depth
        if (!cmSystemTools::Strucmp(this->Functions[c].Name.c_str(),"if"))
          {
          scopeDepth++;
          }
        if (!cmSystemTools::Strucmp(this->Functions[c].Name.c_str(),"endif"))
          {
          scopeDepth--;
          }
        // watch for our state change
        if (scopeDepth == 0 &&
            !cmSystemTools::Strucmp(this->Functions[c].Name.c_str(),"else"))
          {
          this->IsBlocking = this->HasRun;
          this->HasRun = true;

          // if trace is enabled, print a (trivially) evaluated "else"
          // statement
          if(!this->IsBlocking && mf.GetCMakeInstance()->GetTrace())
            {
            mf.PrintCommandTrace(this->Functions[c]);
            }
          }
        else if (scopeDepth == 0 && !cmSystemTools::Strucmp
                 (this->Functions[c].Name.c_str(),"elseif"))
          {
          if (this->HasRun)
            {
            this->IsBlocking = true;
            }
          else
            {
            // if trace is enabled, print the evaluated "elseif" statement
            if(mf.GetCMakeInstance()->GetTrace())
              {
              mf.PrintCommandTrace(this->Functions[c]);
              }

            std::string errorString;

            std::vector<cmExpandedCommandArgument> expandedArguments;
            mf.ExpandArguments(this->Functions[c].Arguments,
                               expandedArguments);

            cmake::MessageType messType;

            cmConditionEvaluator conditionEvaluator(mf);

            bool isTrue = conditionEvaluator.IsTrue(
              expandedArguments, errorString, messType);

            if (!errorString.empty())
              {
              std::string err = cmIfCommandError(expandedArguments);
              err += errorString;
              cmListFileBacktrace bt = mf.GetBacktrace(this->Functions[c]);
              mf.GetCMakeInstance()->IssueMessage(messType, err, bt);
              if (messType == cmake::FATAL_ERROR)
                {
                cmSystemTools::SetFatalErrorOccured();
                return true;
                }
              }

            if (isTrue)
              {
              this->IsBlocking = false;
              this->HasRun = true;
              }
            }
          }

        // should we execute?
        else if (!this->IsBlocking)
          {
          status.Clear();
          mf.ExecuteCommand(this->Functions[c],status);
          if (status.GetReturnInvoked())
            {
            inStatus.SetReturnInvoked(true);
            return true;
            }
          if (status.GetBreakInvoked())
            {
            inStatus.SetBreakInvoked(true);
            return true;
            }
          if (status.GetContinueInvoked())
            {
            inStatus.SetContinueInvoked(true);
            return true;
            }
          }
        }
      return true;
      }
    }

  // record the command
  this->Functions.push_back(lff);

  // always return true
  return true;
}